

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  int iVar1;
  uint uVar2;
  Node *pNVar3;
  __base_type _Var4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Node *prev [12];
  Node *local_88 [13];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar3 = FindGreaterOrEqual(this,key,local_88);
  if (pNVar3 != (Node *)0x0) {
    iVar1 = MemTable::KeyComparator::operator()(&this->compare_,*key,pNVar3->key);
    if (iVar1 == 0) {
      __assert_fail("x == nullptr || !Equal(key, x->key)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/skiplist.h"
                    ,0x158,
                    "void leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Insert(const Key &) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                   );
    }
  }
  uVar2 = RandomHeight(this);
  if ((this->max_height_).super___atomic_base<int>._M_i < (int)uVar2) {
    iVar1 = (this->max_height_).super___atomic_base<int>._M_i;
    if (iVar1 < (int)uVar2) {
      lVar5 = (long)iVar1;
      pNVar3 = this->head_;
      lVar6 = (int)uVar2 - lVar5;
      lVar7 = lVar6 + -1;
      auVar9._8_4_ = (int)lVar7;
      auVar9._0_8_ = lVar7;
      auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
      uVar8 = 0;
      auVar9 = auVar9 ^ _DAT_008110a0;
      do {
        auVar10._8_4_ = (int)uVar8;
        auVar10._0_8_ = uVar8;
        auVar10._12_4_ = (int)(uVar8 >> 0x20);
        auVar10 = (auVar10 | _DAT_00811090) ^ _DAT_008110a0;
        if ((bool)(~(auVar10._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar10._0_4_ ||
                    auVar9._4_4_ < auVar10._4_4_) & 1)) {
          local_88[lVar5 + uVar8] = pNVar3;
        }
        if ((auVar10._12_4_ != auVar9._12_4_ || auVar10._8_4_ <= auVar9._8_4_) &&
            auVar10._12_4_ <= auVar9._12_4_) {
          local_88[lVar5 + uVar8 + 1] = pNVar3;
        }
        uVar8 = uVar8 + 2;
      } while ((lVar6 + 1U & 0xfffffffffffffffe) != uVar8);
    }
    (this->max_height_).super___atomic_base<int>._M_i = uVar2;
  }
  _Var4._M_p = (__pointer_type)Arena::AllocateAligned(this->arena_,(long)(int)uVar2 * 8 + 8);
  (_Var4._M_p)->key = *key;
  (_Var4._M_p)->next_[0]._M_b = (__base_type)0x0;
  if (0 < (int)uVar2) {
    uVar8 = 0;
    do {
      *(__pointer_type *)((long)(_Var4._M_p)->next_ + uVar8 * 8) =
           local_88[uVar8]->next_[uVar8]._M_b._M_p;
      local_88[uVar8]->next_[uVar8]._M_b._M_p = _Var4._M_p;
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SkipList<Key, Comparator>::Insert(const Key& key) {
  // TODO(opt): We can use a barrier-free variant of FindGreaterOrEqual()
  // here since Insert() is externally synchronized.
  Node* prev[kMaxHeight];
  Node* x = FindGreaterOrEqual(key, prev);

  // Our data structure does not allow duplicate insertion
  assert(x == nullptr || !Equal(key, x->key));

  int height = RandomHeight();
  if (height > GetMaxHeight()) {
    for (int i = GetMaxHeight(); i < height; i++) {
      prev[i] = head_;
    }
    // It is ok to mutate max_height_ without any synchronization
    // with concurrent readers.  A concurrent reader that observes
    // the new value of max_height_ will see either the old value of
    // new level pointers from head_ (nullptr), or a new value set in
    // the loop below.  In the former case the reader will
    // immediately drop to the next level since nullptr sorts after all
    // keys.  In the latter case the reader will use the new node.
    max_height_.store(height, std::memory_order_relaxed);
  }

  x = NewNode(key, height);
  for (int i = 0; i < height; i++) {
    // NoBarrier_SetNext() suffices since we will add a barrier when
    // we publish a pointer to "x" in prev[i].
    x->NoBarrier_SetNext(i, prev[i]->NoBarrier_Next(i));
    prev[i]->SetNext(i, x);
  }
}